

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O3

void YuvToBgraRow_SSE2(uint8_t *y,uint8_t *u,uint8_t *v,uint8_t *dst,int len)

{
  undefined4 uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [16];
  undefined1 auVar34 [15];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [15];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [14];
  undefined1 auVar45 [12];
  unkbyte10 Var46;
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  unkbyte9 Var50;
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [13];
  undefined1 auVar55 [15];
  undefined1 auVar56 [13];
  undefined1 auVar57 [15];
  undefined1 auVar58 [13];
  undefined1 auVar59 [15];
  undefined6 uVar60;
  undefined2 uVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  uint uVar69;
  uint8_t uVar70;
  uint uVar71;
  int iVar72;
  long lVar73;
  uint8_t uVar74;
  uint uVar75;
  uint uVar76;
  ushort uVar77;
  undefined2 uVar78;
  undefined1 uVar87;
  undefined1 uVar88;
  char cVar89;
  ushort uVar90;
  undefined1 uVar91;
  byte bVar92;
  ushort uVar93;
  byte bVar94;
  byte bVar95;
  ushort uVar96;
  byte bVar97;
  ushort uVar98;
  ushort uVar99;
  ushort uVar100;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  ushort uVar101;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined4 uVar79;
  undefined6 uVar80;
  undefined8 uVar81;
  undefined1 auVar82 [12];
  undefined1 auVar83 [14];
  undefined1 auVar86 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  
  auVar68 = _DAT_0014a8f0;
  auVar67 = _DAT_0014a8e0;
  auVar66 = _DAT_0014a8c0;
  auVar65 = _DAT_0014a8b0;
  auVar64 = _DAT_0014a890;
  auVar63 = _DAT_0014a880;
  auVar62 = _DAT_00148210;
  uVar69 = 0;
  if (7 < len) {
    uVar69 = len & 0x7ffffff8;
    iVar72 = 8;
    do {
      uVar81 = *(undefined8 *)y;
      bVar97 = (byte)((ulong)uVar81 >> 0x38);
      bVar95 = (byte)((ulong)uVar81 >> 0x30);
      bVar94 = (byte)((ulong)uVar81 >> 0x28);
      auVar51[10] = 0;
      auVar51._0_10_ = SUB1610((undefined1  [16])0x0,0);
      auVar51[0xb] = bVar94;
      bVar92 = (byte)((ulong)uVar81 >> 0x20);
      auVar52[9] = bVar92;
      auVar52._0_9_ = SUB169((undefined1  [16])0x0,0);
      auVar52._10_2_ = auVar51._10_2_;
      auVar53._9_3_ = auVar52._9_3_;
      auVar53._0_9_ = (unkuint9)0;
      uVar91 = (undefined1)((ulong)uVar81 >> 0x18);
      uVar88 = (undefined1)((ulong)uVar81 >> 0x10);
      auVar33._1_10_ = SUB1610(ZEXT516(CONCAT41(auVar53._8_4_,uVar91)) << 0x38,6);
      auVar33[0] = uVar88;
      auVar33._11_5_ = 0;
      uVar87 = (undefined1)((ulong)uVar81 >> 8);
      auVar106._1_12_ = SUB1612(auVar33 << 0x28,4);
      auVar106[0] = uVar87;
      auVar106._13_3_ = 0;
      auVar103._1_14_ = SUB1614(auVar106 << 0x18,2);
      auVar103[0] = (char)uVar81;
      auVar103[0xf] = 0;
      auVar103 = auVar103 << 8;
      auVar18[0xd] = 0;
      auVar18._0_13_ = auVar103._0_13_;
      auVar18[0xe] = uVar91;
      auVar21[0xc] = 0;
      auVar21._0_12_ = auVar103._0_12_;
      auVar21._13_2_ = auVar18._13_2_;
      auVar24[0xb] = 0;
      auVar24._0_11_ = auVar103._0_11_;
      auVar24._12_3_ = auVar21._12_3_;
      auVar27[10] = uVar88;
      auVar27._0_10_ = auVar103._0_10_;
      auVar27._11_4_ = auVar24._11_4_;
      auVar30[9] = 0;
      auVar30._0_9_ = auVar103._0_9_;
      auVar30._10_5_ = auVar27._10_5_;
      auVar34[8] = 0;
      auVar34._0_8_ = auVar103._0_8_;
      auVar34._9_6_ = auVar30._9_6_;
      auVar41._7_8_ = 0;
      auVar41._0_7_ = auVar34._8_7_;
      auVar47._1_8_ = SUB158(auVar41 << 0x40,7);
      auVar47[0] = uVar87;
      auVar47._9_6_ = 0;
      auVar55._10_5_ = 0;
      auVar55._0_10_ = SUB1510(auVar47 << 0x30,5);
      auVar54._1_12_ = SUB1512(auVar55 << 0x28,3);
      auVar54[0] = (char)uVar81;
      auVar102._0_4_ = auVar54._0_4_ << 0x10;
      auVar102._8_4_ = auVar34._8_4_;
      auVar102._4_3_ = auVar21._12_3_;
      auVar102[7] = 0;
      auVar102._12_4_ = SUB154(auVar47 << 0x30,5) << 8;
      auVar103 = pshufhw(auVar102,auVar102,0xc4);
      auVar104._0_4_ = auVar103._0_4_;
      auVar104._8_4_ = auVar103._8_4_;
      auVar104._4_4_ = auVar103._12_4_;
      auVar104._12_4_ = auVar103._4_4_;
      auVar104 = auVar104 & auVar62;
      sVar2 = auVar104._0_2_;
      sVar3 = auVar104._2_2_;
      auVar105[1] = (0 < sVar3) * (sVar3 < 0x100) * auVar104[2] - (0xff < sVar3);
      auVar105[0] = (0 < sVar2) * (sVar2 < 0x100) * auVar104[0] - (0xff < sVar2);
      sVar2 = auVar104._4_2_;
      auVar105[2] = (0 < sVar2) * (sVar2 < 0x100) * auVar104[4] - (0xff < sVar2);
      sVar2 = auVar104._6_2_;
      auVar105[3] = (0 < sVar2) * (sVar2 < 0x100) * auVar104[6] - (0xff < sVar2);
      sVar2 = auVar104._8_2_;
      auVar105[4] = (0 < sVar2) * (sVar2 < 0x100) * auVar104[8] - (0xff < sVar2);
      sVar2 = auVar104._10_2_;
      auVar105[5] = (0 < sVar2) * (sVar2 < 0x100) * auVar104[10] - (0xff < sVar2);
      sVar2 = auVar104._12_2_;
      auVar105[6] = (0 < sVar2) * (sVar2 < 0x100) * auVar104[0xc] - (0xff < sVar2);
      sVar2 = auVar104._14_2_;
      auVar105[7] = (0 < sVar2) * (sVar2 < 0x100) * auVar104[0xe] - (0xff < sVar2);
      auVar105[8] = 0;
      auVar105[9] = (bVar92 != 0) * (bVar92 < 0x100) * bVar92 - (0xff < bVar92);
      auVar105[10] = 0;
      auVar105[0xb] = (bVar94 != 0) * (bVar94 < 0x100) * bVar94 - (0xff < bVar94);
      auVar105[0xc] = 0;
      auVar105[0xd] = (bVar95 != 0) * (bVar95 < 0x100) * bVar95 - (0xff < bVar95);
      auVar105[0xe] = 0;
      auVar105[0xf] = (bVar97 != 0) * (bVar97 < 0x100) * bVar97 - (0xff < bVar97);
      auVar106 = pmulhuw(auVar105,auVar63);
      uVar1 = *(undefined4 *)u;
      bVar92 = (byte)((uint)uVar1 >> 0x18);
      cVar89 = (char)((uint)uVar1 >> 0x10);
      auVar36._1_10_ = SUB1610(ZEXT116(bVar92) << 0x38,6);
      auVar36[0] = cVar89;
      auVar36._11_5_ = 0;
      uVar87 = (undefined1)((uint)uVar1 >> 8);
      auVar35._1_12_ = SUB1612(auVar36 << 0x28,4);
      auVar35[0] = uVar87;
      auVar35._13_3_ = 0;
      auVar116._1_14_ = SUB1614(auVar35 << 0x18,2);
      auVar116[0] = (char)uVar1;
      auVar116[0xf] = 0;
      auVar116 = auVar116 << 8;
      auVar19[0xd] = 0;
      auVar19._0_13_ = auVar116._0_13_;
      auVar19[0xe] = bVar92;
      auVar22[0xc] = 0;
      auVar22._0_12_ = auVar116._0_12_;
      auVar22._13_2_ = auVar19._13_2_;
      auVar25[0xb] = 0;
      auVar25._0_11_ = auVar116._0_11_;
      auVar25._12_3_ = auVar22._12_3_;
      auVar28[10] = cVar89;
      auVar28._0_10_ = auVar116._0_10_;
      auVar28._11_4_ = auVar25._11_4_;
      auVar31[9] = 0;
      auVar31._0_9_ = auVar116._0_9_;
      auVar31._10_5_ = auVar28._10_5_;
      auVar37[8] = 0;
      auVar37._0_8_ = auVar116._0_8_;
      auVar37._9_6_ = auVar31._9_6_;
      auVar42._7_8_ = 0;
      auVar42._0_7_ = auVar37._8_7_;
      auVar48._1_8_ = SUB158(auVar42 << 0x40,7);
      auVar48[0] = uVar87;
      auVar48._9_6_ = 0;
      auVar57._10_5_ = 0;
      auVar57._0_10_ = SUB1510(auVar48 << 0x30,5);
      auVar56._1_12_ = SUB1512(auVar57 << 0x28,3);
      auVar56[0] = (char)uVar1;
      auVar84._4_4_ = auVar37._8_4_;
      auVar84._0_4_ = auVar56._0_4_ << 0x10;
      auVar84._8_4_ = auVar37._8_4_;
      auVar84._12_4_ = SUB154(auVar48 << 0x30,5) << 8;
      auVar103 = pshuflw(auVar84,auVar84,100);
      auVar103 = pshufhw(auVar103,auVar103,0xcc);
      sVar2 = auVar103._0_2_;
      sVar3 = auVar103._2_2_;
      auVar85[1] = (0 < sVar3) * (sVar3 < 0x100) * auVar103[2] - (0xff < sVar3);
      auVar85[0] = (0 < sVar2) * (sVar2 < 0x100) * auVar103[0] - (0xff < sVar2);
      sVar2 = auVar103._4_2_;
      auVar85[2] = (0 < sVar2) * (sVar2 < 0x100) * auVar103[4] - (0xff < sVar2);
      sVar2 = auVar103._6_2_;
      auVar85[3] = (0 < sVar2) * (sVar2 < 0x100) * auVar103[6] - (0xff < sVar2);
      sVar2 = auVar103._8_2_;
      auVar85[4] = (0 < sVar2) * (sVar2 < 0x100) * auVar103[8] - (0xff < sVar2);
      sVar2 = auVar103._10_2_;
      auVar85[5] = (0 < sVar2) * (sVar2 < 0x100) * auVar103[10] - (0xff < sVar2);
      sVar2 = auVar103._12_2_;
      auVar85[6] = (0 < sVar2) * (sVar2 < 0x100) * auVar103[0xc] - (0xff < sVar2);
      sVar2 = auVar103._14_2_;
      auVar85[7] = (0 < sVar2) * (sVar2 < 0x100) * auVar103[0xe] - (0xff < sVar2);
      auVar85[8] = -(0xff < auVar37._8_2_);
      sVar2 = auVar28._10_2_;
      auVar85[9] = (0 < sVar2) * (sVar2 < 0x100) * cVar89 - (0xff < sVar2);
      auVar85[10] = -(0xff < auVar37._8_2_);
      auVar85[0xb] = (0 < sVar2) * (sVar2 < 0x100) * cVar89 - (0xff < sVar2);
      auVar85[0xc] = -(0xff < auVar22._12_2_);
      uVar77 = (ushort)bVar92;
      auVar85[0xd] = (bVar92 != 0) * (uVar77 < 0x100) * bVar92 - (0xff < uVar77);
      auVar85[0xe] = -(0xff < auVar22._12_2_);
      auVar85[0xf] = (bVar92 != 0) * (uVar77 < 0x100) * bVar92 - (0xff < uVar77);
      uVar1 = *(undefined4 *)v;
      bVar92 = (byte)((uint)uVar1 >> 0x18);
      cVar89 = (char)((uint)uVar1 >> 0x10);
      auVar39._1_10_ = SUB1610(ZEXT116(bVar92) << 0x38,6);
      auVar39[0] = cVar89;
      auVar39._11_5_ = 0;
      uVar87 = (undefined1)((uint)uVar1 >> 8);
      auVar38._1_12_ = SUB1612(auVar39 << 0x28,4);
      auVar38[0] = uVar87;
      auVar38._13_3_ = 0;
      auVar117._1_14_ = SUB1614(auVar38 << 0x18,2);
      auVar117[0] = (char)uVar1;
      auVar117[0xf] = 0;
      auVar117 = auVar117 << 8;
      auVar20[0xd] = 0;
      auVar20._0_13_ = auVar117._0_13_;
      auVar20[0xe] = bVar92;
      auVar23[0xc] = 0;
      auVar23._0_12_ = auVar117._0_12_;
      auVar23._13_2_ = auVar20._13_2_;
      auVar26[0xb] = 0;
      auVar26._0_11_ = auVar117._0_11_;
      auVar26._12_3_ = auVar23._12_3_;
      auVar29[10] = cVar89;
      auVar29._0_10_ = auVar117._0_10_;
      auVar29._11_4_ = auVar26._11_4_;
      auVar32[9] = 0;
      auVar32._0_9_ = auVar117._0_9_;
      auVar32._10_5_ = auVar29._10_5_;
      auVar40[8] = 0;
      auVar40._0_8_ = auVar117._0_8_;
      auVar40._9_6_ = auVar32._9_6_;
      auVar43._7_8_ = 0;
      auVar43._0_7_ = auVar40._8_7_;
      auVar49._1_8_ = SUB158(auVar43 << 0x40,7);
      auVar49[0] = uVar87;
      auVar49._9_6_ = 0;
      auVar59._10_5_ = 0;
      auVar59._0_10_ = SUB1510(auVar49 << 0x30,5);
      auVar58._1_12_ = SUB1512(auVar59 << 0x28,3);
      auVar58[0] = (char)uVar1;
      auVar114._0_4_ = auVar58._0_4_ << 0x10;
      auVar114._8_4_ = auVar40._8_4_;
      auVar114._4_4_ = auVar114._8_4_;
      auVar114._12_4_ = SUB154(auVar49 << 0x30,5) << 8;
      auVar103 = pshuflw(auVar114,auVar114,100);
      auVar103 = pshufhw(auVar103,auVar103,0xcc);
      sVar2 = auVar103._0_2_;
      sVar3 = auVar103._2_2_;
      auVar115[1] = (0 < sVar3) * (sVar3 < 0x100) * auVar103[2] - (0xff < sVar3);
      auVar115[0] = (0 < sVar2) * (sVar2 < 0x100) * auVar103[0] - (0xff < sVar2);
      sVar2 = auVar103._4_2_;
      auVar115[2] = (0 < sVar2) * (sVar2 < 0x100) * auVar103[4] - (0xff < sVar2);
      sVar2 = auVar103._6_2_;
      auVar115[3] = (0 < sVar2) * (sVar2 < 0x100) * auVar103[6] - (0xff < sVar2);
      sVar2 = auVar103._8_2_;
      auVar115[4] = (0 < sVar2) * (sVar2 < 0x100) * auVar103[8] - (0xff < sVar2);
      sVar2 = auVar103._10_2_;
      auVar115[5] = (0 < sVar2) * (sVar2 < 0x100) * auVar103[10] - (0xff < sVar2);
      sVar2 = auVar103._12_2_;
      auVar115[6] = (0 < sVar2) * (sVar2 < 0x100) * auVar103[0xc] - (0xff < sVar2);
      sVar2 = auVar103._14_2_;
      auVar115[7] = (0 < sVar2) * (sVar2 < 0x100) * auVar103[0xe] - (0xff < sVar2);
      auVar115[8] = -(0xff < auVar40._8_2_);
      sVar2 = auVar29._10_2_;
      auVar115[9] = (0 < sVar2) * (sVar2 < 0x100) * cVar89 - (0xff < sVar2);
      auVar115[10] = -(0xff < auVar40._8_2_);
      auVar115[0xb] = (0 < sVar2) * (sVar2 < 0x100) * cVar89 - (0xff < sVar2);
      auVar115[0xc] = -(0xff < auVar23._12_2_);
      uVar77 = (ushort)bVar92;
      auVar115[0xd] = (bVar92 != 0) * (uVar77 < 0x100) * bVar92 - (0xff < uVar77);
      auVar115[0xe] = -(0xff < auVar23._12_2_);
      auVar115[0xf] = (bVar92 != 0) * (uVar77 < 0x100) * bVar92 - (0xff < uVar77);
      auVar103 = pmulhuw(auVar115,auVar64);
      auVar112._0_2_ = auVar103._0_2_ + auVar106._0_2_ + -0x379a;
      auVar112._2_2_ = auVar103._2_2_ + auVar106._2_2_ + -0x379a;
      auVar112._4_2_ = auVar103._4_2_ + auVar106._4_2_ + -0x379a;
      auVar112._6_2_ = auVar103._6_2_ + auVar106._6_2_ + -0x379a;
      auVar112._8_2_ = auVar103._8_2_ + auVar106._8_2_ + -0x379a;
      auVar112._10_2_ = auVar103._10_2_ + auVar106._10_2_ + -0x379a;
      auVar112._12_2_ = auVar103._12_2_ + auVar106._12_2_ + -0x379a;
      auVar112._14_2_ = auVar103._14_2_ + auVar106._14_2_ + -0x379a;
      auVar117 = pmulhuw(auVar85,auVar65);
      auVar116 = pmulhuw(auVar115,auVar66);
      auVar103 = pmulhuw(auVar85,auVar67);
      auVar103 = paddusw(auVar103,auVar106);
      auVar107._0_2_ = (auVar106._0_2_ - (auVar116._0_2_ + auVar117._0_2_)) + 0x2204;
      auVar107._2_2_ = (auVar106._2_2_ - (auVar116._2_2_ + auVar117._2_2_)) + 0x2204;
      auVar107._4_2_ = (auVar106._4_2_ - (auVar116._4_2_ + auVar117._4_2_)) + 0x2204;
      auVar107._6_2_ = (auVar106._6_2_ - (auVar116._6_2_ + auVar117._6_2_)) + 0x2204;
      auVar107._8_2_ = (auVar106._8_2_ - (auVar116._8_2_ + auVar117._8_2_)) + 0x2204;
      auVar107._10_2_ = (auVar106._10_2_ - (auVar116._10_2_ + auVar117._10_2_)) + 0x2204;
      auVar107._12_2_ = (auVar106._12_2_ - (auVar116._12_2_ + auVar117._12_2_)) + 0x2204;
      auVar107._14_2_ = (auVar106._14_2_ - (auVar116._14_2_ + auVar117._14_2_)) + 0x2204;
      auVar103 = psubusw(auVar103,auVar68);
      auVar117 = psraw(auVar112,6);
      auVar116 = psraw(auVar107,6);
      sVar2 = auVar116._0_2_;
      sVar3 = auVar116._2_2_;
      sVar4 = auVar116._4_2_;
      sVar5 = auVar116._6_2_;
      sVar6 = auVar116._8_2_;
      sVar7 = auVar116._10_2_;
      sVar8 = auVar116._12_2_;
      sVar9 = auVar116._14_2_;
      uVar77 = auVar103._0_2_ >> 6;
      uVar90 = auVar103._2_2_ >> 6;
      uVar93 = auVar103._4_2_ >> 6;
      uVar96 = auVar103._6_2_ >> 6;
      uVar98 = auVar103._8_2_ >> 6;
      uVar99 = auVar103._10_2_ >> 6;
      uVar100 = auVar103._12_2_ >> 6;
      uVar101 = auVar103._14_2_ >> 6;
      cVar89 = (uVar101 != 0) * (uVar101 < 0x100) * (char)uVar101 - (0xff < uVar101);
      sVar10 = auVar117._0_2_;
      sVar11 = auVar117._2_2_;
      sVar12 = auVar117._4_2_;
      sVar13 = auVar117._6_2_;
      sVar14 = auVar117._8_2_;
      sVar15 = auVar117._10_2_;
      sVar16 = auVar117._12_2_;
      sVar17 = auVar117._14_2_;
      uVar61 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * auVar116[0xe] - (0xff < sVar9),cVar89);
      uVar1 = CONCAT31(CONCAT21(uVar61,(0 < sVar8) * (sVar8 < 0x100) * auVar116[0xc] -
                                       (0xff < sVar8)),
                       (uVar100 != 0) * (uVar100 < 0x100) * (char)uVar100 - (0xff < uVar100));
      uVar60 = CONCAT51(CONCAT41(uVar1,(0 < sVar7) * (sVar7 < 0x100) * auVar116[10] - (0xff < sVar7)
                                ),(uVar99 != 0) * (uVar99 < 0x100) * (char)uVar99 - (0xff < uVar99))
      ;
      Var50 = CONCAT72(CONCAT61(uVar60,(0 < sVar6) * (sVar6 < 0x100) * auVar116[8] - (0xff < sVar6))
                       ,CONCAT11((uVar98 != 0) * (uVar98 < 0x100) * (char)uVar98 - (0xff < uVar98),
                                 cVar89));
      Var46 = CONCAT91(CONCAT81((long)((unkuint9)Var50 >> 8),
                                (0 < sVar5) * (sVar5 < 0x100) * auVar116[6] - (0xff < sVar5)),
                       (uVar96 != 0) * (uVar96 < 0x100) * (char)uVar96 - (0xff < uVar96));
      auVar45._2_10_ = Var46;
      auVar45[1] = (0 < sVar4) * (sVar4 < 0x100) * auVar116[4] - (0xff < sVar4);
      auVar45[0] = (uVar93 != 0) * (uVar93 < 0x100) * (char)uVar93 - (0xff < uVar93);
      auVar44._2_12_ = auVar45;
      auVar44[1] = (0 < sVar3) * (sVar3 < 0x100) * auVar116[2] - (0xff < sVar3);
      auVar44[0] = (uVar90 != 0) * (uVar90 < 0x100) * (char)uVar90 - (0xff < uVar90);
      auVar113._0_2_ =
           CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar116[0] - (0xff < sVar2),
                    (uVar77 != 0) * (uVar77 < 0x100) * (char)uVar77 - (0xff < uVar77));
      auVar113._2_14_ = auVar44;
      uVar78 = CONCAT11(0xff,(0 < sVar10) * (sVar10 < 0x100) * auVar117[0] - (0xff < sVar10));
      uVar79 = CONCAT13(0xff,CONCAT12((0 < sVar11) * (sVar11 < 0x100) * auVar117[2] -
                                      (0xff < sVar11),uVar78));
      uVar80 = CONCAT15(0xff,CONCAT14((0 < sVar12) * (sVar12 < 0x100) * auVar117[4] -
                                      (0xff < sVar12),uVar79));
      uVar81 = CONCAT17(0xff,CONCAT16((0 < sVar13) * (sVar13 < 0x100) * auVar117[6] -
                                      (0xff < sVar13),uVar80));
      auVar82._0_10_ =
           CONCAT19(0xff,CONCAT18((0 < sVar14) * (sVar14 < 0x100) * auVar117[8] - (0xff < sVar14),
                                  uVar81));
      auVar82[10] = (0 < sVar15) * (sVar15 < 0x100) * auVar117[10] - (0xff < sVar15);
      auVar82[0xb] = 0xff;
      auVar83[0xc] = (0 < sVar16) * (sVar16 < 0x100) * auVar117[0xc] - (0xff < sVar16);
      auVar83._0_12_ = auVar82;
      auVar83[0xd] = 0xff;
      auVar86[0xe] = (0 < sVar17) * (sVar17 < 0x100) * auVar117[0xe] - (0xff < sVar17);
      auVar86._0_14_ = auVar83;
      auVar86[0xf] = 0xff;
      auVar111._0_12_ = auVar113._0_12_;
      auVar111._12_2_ = (short)Var46;
      auVar111._14_2_ = (short)((ulong)uVar81 >> 0x30);
      auVar110._12_4_ = auVar111._12_4_;
      auVar110._0_10_ = auVar113._0_10_;
      auVar110._10_2_ = (short)((uint6)uVar80 >> 0x20);
      auVar109._10_6_ = auVar110._10_6_;
      auVar109._0_8_ = auVar113._0_8_;
      auVar109._8_2_ = auVar45._0_2_;
      auVar108._8_8_ = auVar109._8_8_;
      auVar108._6_2_ = (short)((uint)uVar79 >> 0x10);
      auVar108._4_2_ = auVar44._0_2_;
      auVar108._2_2_ = uVar78;
      auVar108._0_2_ = auVar113._0_2_;
      *(undefined1 (*) [16])dst = auVar108;
      *(short *)*(undefined1 (*) [16])((long)dst + 0x10) = (short)((unkuint9)Var50 >> 8);
      *(short *)(*(undefined1 (*) [16])((long)dst + 0x10) + 2) =
           (short)((unkuint10)auVar82._0_10_ >> 0x40);
      *(short *)(*(undefined1 (*) [16])((long)dst + 0x10) + 4) = (short)uVar60;
      *(short *)(*(undefined1 (*) [16])((long)dst + 0x10) + 6) = auVar82._10_2_;
      *(short *)(*(undefined1 (*) [16])((long)dst + 0x10) + 8) = (short)uVar1;
      *(short *)(*(undefined1 (*) [16])((long)dst + 0x10) + 10) = auVar83._12_2_;
      *(undefined2 *)(*(undefined1 (*) [16])((long)dst + 0x10) + 0xc) = uVar61;
      *(short *)(*(undefined1 (*) [16])((long)dst + 0x10) + 0xe) = auVar86._14_2_;
      y = y + 8;
      u = u + 4;
      v = v + 4;
      dst = (uint8_t *)((long)dst + 0x20);
      iVar72 = iVar72 + 8;
    } while (iVar72 <= len);
  }
  if ((int)uVar69 < len) {
    lVar73 = 0;
    do {
      bVar92 = *u;
      bVar94 = *v;
      uVar71 = (uint)y[lVar73] * 0x4a85 >> 8;
      uVar75 = ((uint)bVar92 * 0x811a >> 8) + uVar71;
      uVar76 = uVar75 - 0x4515;
      uVar74 = (uVar75 < 0x4515) + 0xff;
      if (uVar76 < 0x4000) {
        uVar74 = (uint8_t)(uVar76 >> 6);
      }
      (*(undefined1 (*) [16])dst)[lVar73 * 4] = uVar74;
      iVar72 = ((uint)bVar94 * 0x3408 >> 8) + ((uint)bVar92 * 0x1913 >> 8);
      uVar75 = (uVar71 - iVar72) + 0x2204;
      uVar74 = -(-0x2205 < (int)(uVar71 - iVar72));
      if (uVar75 < 0x4000) {
        uVar74 = (uint8_t)(uVar75 >> 6);
      }
      uVar71 = ((uint)bVar94 * 0x6625 >> 8) + uVar71;
      uVar75 = uVar71 - 0x379a;
      uVar70 = (uVar71 < 0x379a) + 0xff;
      if (uVar75 < 0x4000) {
        uVar70 = (uint8_t)(uVar75 >> 6);
      }
      (*(undefined1 (*) [16])dst)[lVar73 * 4 + 1] = uVar74;
      (*(undefined1 (*) [16])dst)[lVar73 * 4 + 2] = uVar70;
      (*(undefined1 (*) [16])dst)[lVar73 * 4 + 3] = 0xff;
      uVar71 = uVar69 + (int)lVar73 & 1;
      u = u + uVar71;
      v = v + uVar71;
      lVar73 = lVar73 + 1;
    } while (len - uVar69 != (int)lVar73);
  }
  return;
}

Assistant:

static void YuvToBgraRow_SSE2(const uint8_t* y,
                              const uint8_t* u, const uint8_t* v,
                              uint8_t* dst, int len) {
  const __m128i kAlpha = _mm_set1_epi16(255);
  int n;
  for (n = 0; n + 8 <= len; n += 8, dst += 32) {
    __m128i R, G, B;
    YUV420ToRGB_SSE2(y, u, v, &R, &G, &B);
    PackAndStore4_SSE2(&B, &G, &R, &kAlpha, dst);
    y += 8;
    u += 4;
    v += 4;
  }
  for (; n < len; ++n) {   // Finish off
    VP8YuvToBgra(y[0], u[0], v[0], dst);
    dst += 4;
    y += 1;
    u += (n & 1);
    v += (n & 1);
  }
}